

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

pair<cmQtAutoGen::IntegerVersion,_unsigned_int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget *target)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  pointer pIVar4;
  IntegerVersion IVar5;
  uint uVar6;
  uint uVar7;
  cmMakefile *this;
  ulong uVar8;
  long lVar9;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> pVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> knownQtVersions;
  IntegerVersion local_a8;
  string local_a0;
  string local_80;
  uint local_5c;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> local_58;
  cmMakefile *local_38;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"QT_MAJOR_VERSION","");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  pcVar2 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty(target,&local_a0,&local_80);
  local_58.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uVar6 = 0;
  if ((pcVar2 != (char *)0x0) &&
     (bVar1 = cmSystemTools::StringToULong(pcVar2,(unsigned_long *)&local_58), uVar6 = 0, bVar1)) {
    uVar6 = (uint)local_58.
                  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ == '\0') {
    GetQtVersion();
  }
  local_58.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c = uVar6;
  std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::reserve
            (&local_58,6);
  this = target->Target->Makefile;
  lVar9 = 8;
  local_38 = this;
  do {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,*(long *)((long)&GetParallelCPUCount()::count + lVar9),
               *(long *)((long)&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ +
                        lVar9) + *(long *)((long)&GetParallelCPUCount()::count + lVar9));
    std::__cxx11::string::append((char *)&local_a0);
    pcVar2 = cmMakefile::GetDefinition(this,&local_a0);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,*(long *)((long)&GetParallelCPUCount()::count + lVar9),
               *(long *)((long)&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ +
                        lVar9) + *(long *)((long)&GetParallelCPUCount()::count + lVar9));
    std::__cxx11::string::append((char *)&local_80);
    pcVar3 = cmMakefile::GetDefinition(this,&local_80);
    local_a8.Major = 0;
    local_a8.Minor = 0;
    uVar6 = 0;
    if (pcVar2 != (char *)0x0) {
      bVar1 = cmSystemTools::StringToULong(pcVar2,(unsigned_long *)&local_a8);
      uVar6 = 0;
      if (bVar1) {
        uVar6 = local_a8.Major;
      }
    }
    local_a8.Major = 0;
    local_a8.Minor = 0;
    uVar7 = 0;
    if ((pcVar3 != (char *)0x0) &&
       (bVar1 = cmSystemTools::StringToULong(pcVar3,(unsigned_long *)&local_a8), uVar7 = 0, bVar1))
    {
      uVar7 = local_a8.Major;
    }
    local_a8.Minor = uVar7;
    local_a8.Major = uVar6;
    if (uVar6 != 0) {
      std::vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>>::
      emplace_back<cmQtAutoGen::IntegerVersion&>
                ((vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>> *)
                 &local_58,&local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    this = local_38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x68);
  lVar9 = 8;
  do {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,*(long *)((long)&GetParallelCPUCount()::count + lVar9),
               *(long *)((long)&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ +
                        lVar9) + *(long *)((long)&GetParallelCPUCount()::count + lVar9));
    std::__cxx11::string::append((char *)&local_a0);
    pcVar2 = cmMakefile::GetProperty(this,&local_a0);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,*(long *)((long)&GetParallelCPUCount()::count + lVar9),
               *(long *)((long)&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ +
                        lVar9) + *(long *)((long)&GetParallelCPUCount()::count + lVar9));
    std::__cxx11::string::append((char *)&local_80);
    pcVar3 = cmMakefile::GetProperty(this,&local_80);
    local_a8.Major = 0;
    local_a8.Minor = 0;
    uVar6 = 0;
    if (pcVar2 != (char *)0x0) {
      bVar1 = cmSystemTools::StringToULong(pcVar2,(unsigned_long *)&local_a8);
      uVar6 = 0;
      if (bVar1) {
        uVar6 = local_a8.Major;
      }
    }
    local_a8.Major = 0;
    local_a8.Minor = 0;
    uVar7 = 0;
    if ((pcVar3 != (char *)0x0) &&
       (bVar1 = cmSystemTools::StringToULong(pcVar3,(unsigned_long *)&local_a8), uVar7 = 0, bVar1))
    {
      uVar7 = local_a8.Major;
    }
    local_a8.Minor = uVar7;
    local_a8.Major = uVar6;
    if (uVar6 != 0) {
      std::vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>>::
      emplace_back<cmQtAutoGen::IntegerVersion&>
                ((vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>> *)
                 &local_58,&local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    this = local_38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    uVar6 = local_5c;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x68);
  IVar5.Major = 0;
  IVar5.Minor = 0;
  if (local_58.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_58.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar8 = 0;
LAB_001dfa5a:
    if (local_58.
        super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_001dfa6c;
  }
  else {
    pIVar4 = local_58.
             super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_5c != 0) {
      do {
        if (pIVar4->Major == local_5c) {
          uVar8 = (ulong)pIVar4->Minor;
          IVar5.Minor = 0;
          IVar5.Major = local_5c;
          goto LAB_001dfa5a;
        }
        pIVar4 = pIVar4 + 1;
      } while (pIVar4 != local_58.
                         super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      uVar8 = 0;
      goto LAB_001dfa5a;
    }
    IVar5 = *local_58.
             super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (ulong)IVar5 >> 0x20;
  }
  operator_delete(local_58.
                  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_58.
                        super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_58.
                        super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                        ._M_impl.super__Vector_impl_data._M_start);
LAB_001dfa6c:
  pVar10.first = (IntegerVersion)((ulong)IVar5 & 0xffffffff | uVar8 << 0x20);
  pVar10.second = uVar6;
  return pVar10;
}

Assistant:

std::pair<cmQtAutoGen::IntegerVersion, unsigned int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget const* target)
{
  std::pair<IntegerVersion, unsigned int> res(
    IntegerVersion(),
    CharPtrToUInt(target->GetLinkInterfaceDependentStringProperty(
      "QT_MAJOR_VERSION", "")));

  auto knownQtVersions = GetKnownQtVersions(target);
  if (!knownQtVersions.empty()) {
    if (res.second == 0) {
      // No specific version was requested by the target:
      // Use highest known Qt version.
      res.first = knownQtVersions.at(0);
    } else {
      // Pick a version from the known versions:
      for (auto it : knownQtVersions) {
        if (it.Major == res.second) {
          res.first = it;
          break;
        }
      }
    }
  }
  return res;
}